

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightedSnapshot.cc
# Opt level: O1

double __thiscall cppmetrics::WeightedSnapshot::get_value(WeightedSnapshot *this,double quantile)

{
  pointer pEVar1;
  pointer pEVar2;
  int iVar3;
  undefined4 extraout_var;
  pointer pEVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  domain_error *this_00;
  long lVar5;
  difference_type __d;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  
  if ((0.0 <= quantile) && (quantile <= 1.0)) {
    iVar3 = (*(this->super_Snapshot)._vptr_Snapshot[3])();
    if (CONCAT44(extraout_var,iVar3) == 0) {
      dVar9 = 0.0;
    }
    else {
      pEVar1 = (this->m_elements).
               super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar2 = (this->m_elements).
               super__Vector_base<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = (long)pEVar2 - (long)pEVar1;
      pEVar4 = pEVar1;
      if (0 < (long)uVar6) {
        uVar6 = (uVar6 >> 3) * -0x5555555555555555;
        do {
          uVar7 = uVar6 >> 1;
          uVar8 = uVar7;
          if (pEVar4[uVar7].quantile <= quantile && quantile != pEVar4[uVar7].quantile) {
            uVar8 = ~uVar7 + uVar6;
            pEVar4 = pEVar4 + uVar7 + 1;
          }
          uVar6 = uVar8;
        } while (0 < (long)uVar8);
      }
      if (pEVar4 == pEVar1) {
        iVar3 = (*(this->super_Snapshot)._vptr_Snapshot[4])(this);
        lVar5 = CONCAT44(extraout_var_00,iVar3);
      }
      else if (pEVar4 == pEVar2) {
        iVar3 = (*(this->super_Snapshot)._vptr_Snapshot[6])(this);
        lVar5 = CONCAT44(extraout_var_01,iVar3);
      }
      else {
        dVar9 = pEVar4->quantile;
        lVar5 = 0;
        if (quantile < dVar9) {
          lVar5 = -0x18;
        }
        if (NAN(dVar9)) {
          lVar5 = -0x18;
        }
        if (dVar9 < quantile) {
          lVar5 = -0x18;
        }
        lVar5 = *(long *)((long)&pEVar4->value + lVar5);
      }
      dVar9 = (double)lVar5;
    }
    return dVar9;
  }
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::domain_error::domain_error(this_00,"Quantile must be between 0.0 and 1.0");
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

double WeightedSnapshot::get_value(double quantile) const
{
  if (quantile < 0 || quantile > 1.0 || std::isnan(quantile))
  {
    throw std::domain_error{"Quantile must be between 0.0 and 1.0"};
  }

  if (size() == 0)
  {
    return 0.0;
  }

  auto lb = std::lower_bound(
    std::begin(m_elements), std::end(m_elements), quantile,
    [](const Element& element, const double& q) { return element.quantile < q; }
  );

  if (lb == std::begin(m_elements))
  {
    // All values are of a greater quantile than requested; just return
    // the least.
    return get_min();
  }

  if (lb == std::end(m_elements))
  {
    // All values have a smaller quantile than requested; return the max.
    return get_max();
  }

  // At this point lb is pointed to the first element *not less than* the request
  // quantile.  Back up one and return its value.
  if (!HasEquivalentOrder(quantile, lb->quantile))
  {
    --lb;
  }

  return lb->value;
}